

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O0

void __thiscall xemmai::t_fiber::t_internal::f_epoch_scan(t_internal *this)

{
  t_pvalue *ptVar1;
  t_object **pptVar2;
  long lVar3;
  t_object *ptVar4;
  lock_guard<std::mutex> this_00;
  pointer ptVar5;
  mutex *__m;
  t_object ***ppptVar6;
  lock_guard<std::mutex> *local_78;
  anon_class_8_1_53bbeb80 increment;
  t_object **local_60;
  t_object **p1;
  t_object **p0;
  lock_guard<std::mutex> lock;
  t_engine *engine;
  t_object **top2;
  t_object **top1;
  t_object **top0;
  long n;
  t_object **used2;
  t_object **used1;
  t_internal *this_local;
  
  ptVar1 = this->v_estack_used;
  pptVar2 = this->v_estack_last_head;
  used1 = (t_object **)this;
  ptVar5 = std::
           unique_ptr<xemmai::t_value<xemmai::t_pointer>[],_std::default_delete<xemmai::t_value<xemmai::t_pointer>[]>_>
           ::get(&this->v_estack);
  used2 = (t_object **)((long)pptVar2 + ((long)ptVar1 - (long)ptVar5 >> 1));
  n = (long)this->v_estack_last_used;
  this->v_estack_last_used = used2;
  top0 = (t_object **)((long)this->v_stack_bottom - (long)this->v_stack_top >> 3);
  top1 = this->v_stack_copy + -(long)top0;
  top2 = this->v_stack_last_bottom + -(long)top0;
  engine = (t_engine *)this->v_stack_last_top;
  this->v_stack_last_top = top2;
  lock._M_device = (mutex_type *)f_engine();
  __m = t_heap<xemmai::t_object>::f_mutex(&((t_engine *)lock._M_device)->v_object__heap);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&p0,__m);
  p1 = std::unique_ptr<xemmai::t_object_*[],_std::default_delete<xemmai::t_object_*[]>_>::get
                 (&this->v_estack_buffer);
  this_00 = lock;
  this->v_estack_decrements = p1;
  local_60 = this->v_estack_last_head;
  ppptVar6 = std::min<xemmai::t_object**>(&used2,(t_object ***)&n);
  t_engine::f_epoch_increment
            ((t_engine *)this_00._M_device,&p1,&local_60,*ppptVar6,&this->v_estack_decrements);
  local_78 = &lock;
  if ((ulong)n < used2) {
    f_epoch_scan()::$_0::operator()((__0 *)&local_78,&p1,&local_60,used2);
  }
  else {
    for (; local_60 < (ulong)n; local_60 = local_60 + 1) {
      if (*local_60 != (t_object *)0x0) {
        ptVar4 = *local_60;
        pptVar2 = this->v_estack_decrements;
        this->v_estack_decrements = pptVar2 + 1;
        *pptVar2 = ptVar4;
      }
    }
  }
  this->v_stack_decrements = this->v_stack_last_bottom;
  if (top2 < engine) {
    f_epoch_scan()::$_0::operator()((__0 *)&local_78,&top1,&top2,(t_object **)engine);
  }
  else {
    for (; engine < top2; engine = (t_engine *)&engine->v_collector__tick) {
      lVar3._0_1_ = engine->v_collector__running;
      lVar3._1_1_ = engine->v_collector__quitting;
      lVar3._2_6_ = *(undefined6 *)&engine->field_0x2;
      if (lVar3 != 0) {
        ptVar4 = *(t_object **)engine;
        pptVar2 = this->v_stack_decrements;
        this->v_stack_decrements = pptVar2 + 1;
        *pptVar2 = ptVar4;
      }
    }
  }
  t_engine::f_epoch_increment
            ((t_engine *)lock._M_device,&top1,&top2,this->v_stack_last_bottom,
             &this->v_stack_decrements);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&p0);
  return;
}

Assistant:

void t_fiber::t_internal::f_epoch_scan()
{
	auto used1 = v_estack_last_head + (v_estack_used - v_estack.get());
	auto used2 = v_estack_last_used;
	v_estack_last_used = used1;
	auto n = v_stack_bottom - v_stack_top;
	auto top0 = v_stack_copy - n;
	auto top1 = v_stack_last_bottom - n;
	auto top2 = v_stack_last_top;
	v_stack_last_top = top1;
	auto engine = f_engine();
	std::lock_guard lock(engine->v_object__heap.f_mutex());
	auto p0 = v_estack_decrements = v_estack_buffer.get();
	auto p1 = v_estack_last_head;
	engine->f_epoch_increment(p0, p1, std::min(used1, used2), v_estack_decrements);
	auto increment = [&](auto& p0, auto& p1, auto p2)
	{
		do {
			auto p = engine->f_object__find(*p0++);
			if (p) p->f_increment();
			*p1++ = p;
		} while (p1 < p2);
	};
	if (used1 > used2)
		increment(p0, p1, used1);
	else
		for (; p1 < used2; ++p1) if (*p1) *v_estack_decrements++ = *p1;
	v_stack_decrements = v_stack_last_bottom;
	if (top1 < top2)
		increment(top0, top1, top2);
	else
		for (; top2 < top1; ++top2) if (*top2) *v_stack_decrements++ = *top2;
	engine->f_epoch_increment(top0, top1, v_stack_last_bottom, v_stack_decrements);
}